

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

int __thiscall ev3dev::led::max_brightness(led *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"max_brightness",&local_31);
  iVar1 = device::get_attr_int(&this->super_device,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int max_brightness() const { return get_attr_int("max_brightness"); }